

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O3

void Function_Template::SetupFunction(string *namespaceName)

{
  int iVar1;
  ThreadPool *this;
  
  iVar1 = std::__cxx11::string::compare((char *)namespaceName);
  if (iVar1 == 0) {
    simd::EnableSimd(true);
    this = ThreadPoolMonoid::instance();
    ThreadPool::resize(this,4);
    return;
  }
  iVar1 = std::__cxx11::string::compare((char *)namespaceName);
  if (iVar1 == 0) {
    simd::EnableSimd(false);
    simd::EnableAvx(true);
    return;
  }
  iVar1 = std::__cxx11::string::compare((char *)namespaceName);
  if (iVar1 == 0) {
    simd::EnableSimd(false);
    simd::EnableSse(true);
    return;
  }
  iVar1 = std::__cxx11::string::compare((char *)namespaceName);
  if (iVar1 != 0) {
    return;
  }
  simd::EnableSimd(false);
  simd::EnableNeon(true);
  return;
}

Assistant:

void SetupFunction( const std::string & namespaceName )
    {
        if ( namespaceName == "function_pool" ) {
            simd::EnableSimd( true );
            ThreadPoolMonoid::instance().resize( 4 );
        }
        else if ( namespaceName == "image_function_avx" ) {
            simd::EnableSimd( false );
            simd::EnableAvx( true );
        }
        else if ( namespaceName == "image_function_sse" ) {
            simd::EnableSimd( false );
            simd::EnableSse( true );
        }
        else if ( namespaceName == "image_function_neon" ) {
            simd::EnableSimd( false );
            simd::EnableNeon( true );
        }
    }